

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O1

void __thiscall clickhouse::BufferedOutput::~BufferedOutput(BufferedOutput *this)

{
  ~BufferedOutput(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

BufferedOutput::~BufferedOutput() {
    Flush();
}